

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::oct_int(spec *param_1)

{
  either *in_RDI;
  anon_class_1_0_00000001 digit07;
  either *this;
  either *in_stack_ffffffffffffff30;
  repeat_at_least *in_stack_ffffffffffffff38;
  either *in_stack_ffffffffffffff40;
  literal *in_stack_ffffffffffffff48;
  sequence *in_stack_ffffffffffffff50;
  
  this = in_RDI;
  literal::literal<3ul>((literal *)in_RDI,(char (*) [3])in_RDI);
  oct_int::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)in_RDI);
  oct_int::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)in_RDI);
  character::character((character *)this,(char_type)((ulong)in_RDI >> 0x38));
  oct_int::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)in_RDI);
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            ((sequence *)in_stack_ffffffffffffff40,(character *)in_stack_ffffffffffffff38,
             (character_in_range *)in_stack_ffffffffffffff30);
  either::either<toml::detail::character_in_range,toml::detail::sequence>
            (in_stack_ffffffffffffff40,(character_in_range *)in_stack_ffffffffffffff38,
             (sequence *)in_stack_ffffffffffffff30);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
  sequence::
  sequence<toml::detail::literal,toml::detail::character_in_range,toml::detail::repeat_at_least>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (character_in_range *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  either::~either(this);
  sequence::~sequence((sequence *)this);
  character_in_range::~character_in_range((character_in_range *)0x699e0f);
  character::~character((character *)0x699e19);
  character_in_range::~character_in_range((character_in_range *)0x699e23);
  character_in_range::~character_in_range((character_in_range *)0x699e30);
  literal::~literal((literal *)0x699e3d);
  return (sequence *)this;
}

Assistant:

TOML11_INLINE sequence oct_int(const spec&)
{
    const auto digit07 = []() {
        return character_in_range(char_type('0'), char_type('7'));
    };
    return sequence(
            literal("0o"),
            digit07(),
            repeat_at_least(0,
                either(
                    digit07(),
                    sequence(character(char_type('_')), digit07())
                )
            )
        );
}